

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O2

void applyCoeffs(gdImagePtr src,gdImagePtr dst,double *coeffs,int radius,gdAxis axis)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint *puVar12;
  long lVar13;
  int ndx;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  auVar6 = _DAT_00123c80;
  uVar2 = src->red[(ulong)(axis != HORIZONTAL) - 3];
  uVar14 = 0;
  if (0 < (int)uVar2) {
    uVar14 = (ulong)uVar2;
  }
  uVar5 = src->red[(ulong)(axis == HORIZONTAL) - 3];
  if (src->red[(ulong)(axis == HORIZONTAL) - 3] < 1) {
    uVar5 = 0;
  }
  for (uVar17 = 0; uVar17 != uVar5; uVar17 = uVar17 + 1) {
    lVar20 = (long)-radius;
    for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
      uVar11 = uVar15;
      if (axis == HORIZONTAL) {
        uVar11 = uVar17;
      }
      dVar23 = 0.0;
      dVar24 = 0.0;
      dVar3 = 0.0;
      dVar4 = 0.0;
      lVar19 = lVar20;
      for (lVar13 = (long)-radius; lVar13 <= radius; lVar13 = lVar13 + 1) {
        uVar8 = (int)lVar13 + (int)uVar15;
        if (lVar19 < 0) {
          iVar9 = -uVar8;
        }
        else {
          iVar9 = (int)lVar19;
          if ((int)uVar2 <= lVar19) {
            iVar9 = ~uVar8 + uVar2 * 2;
          }
        }
        if (axis == HORIZONTAL) {
          puVar12 = (uint *)(src->tpixels[uVar17] + iVar9);
        }
        else {
          puVar12 = (uint *)(src->tpixels[iVar9] + uVar17);
        }
        uVar8 = *puVar12;
        dVar1 = coeffs[radius + lVar13];
        dVar23 = dVar23 + (double)(uVar8 & 0xff) * dVar1;
        dVar24 = dVar24 + (double)(uVar8 >> 8 & 0xff) * dVar1;
        dVar3 = dVar3 + dVar1 * (double)(uVar8 >> 0x10 & 0xff);
        dVar4 = dVar4 + dVar1 * (double)(uVar8 >> 0x18 & 0x7f);
        lVar19 = lVar19 + 1;
      }
      uVar7 = uVar17;
      if (axis == HORIZONTAL) {
        uVar7 = uVar15;
      }
      uVar8 = 0x7f;
      if (dVar4 < 0.0) {
        uVar8 = 0;
      }
      uVar22 = 0xff;
      if (dVar3 < 0.0) {
        uVar22 = 0;
      }
      uVar18 = 0xff;
      if (dVar24 < 0.0) {
        uVar18 = 0;
      }
      auVar25._0_4_ = (int)(dVar23 + 0.5) << 0x10;
      auVar25._4_4_ = (int)(dVar24 + 0.5) << 0x10;
      auVar25._8_4_ = (int)(dVar3 + 0.5) << 0x10;
      auVar25._12_4_ = (int)(dVar4 + 0.5) << 0x10;
      auVar25 = auVar25 ^ auVar6;
      auVar26._0_2_ = -(ushort)(-0x7f01 < auVar25._0_2_);
      auVar26._2_2_ = -(ushort)(-0x7f01 < auVar25._2_2_);
      auVar26._4_2_ = -(ushort)(-0x7f01 < auVar25._4_2_);
      auVar26._6_2_ = -(ushort)(-0x7f01 < auVar25._6_2_);
      auVar26._8_2_ = -(ushort)(-0x7f01 < auVar25._8_2_);
      auVar26._10_2_ = -(ushort)(-0x7f01 < auVar25._10_2_);
      auVar26._12_2_ = -(ushort)(-0x7f81 < auVar25._12_2_);
      auVar26._14_2_ = -(ushort)(-0x7f81 < auVar25._14_2_);
      uVar16 = movmskps(uVar2 * 2,auVar26);
      uVar10 = (int)(dVar4 + 0.5) & 0xffff;
      if ((uVar16 & 8) != 0) {
        uVar10 = uVar8;
      }
      uVar8 = (int)(dVar3 + 0.5) & 0xffff;
      if ((uVar16 & 4) != 0) {
        uVar8 = uVar22;
      }
      uVar22 = (int)(dVar24 + 0.5) & 0xffff;
      if ((uVar16 & 2) != 0) {
        uVar22 = uVar18;
      }
      uVar18 = 0xff;
      if (dVar23 < 0.0) {
        uVar18 = 0;
      }
      uVar21 = (int)(dVar23 + 0.5);
      if ((uVar16 & 1) != 0) {
        uVar21 = uVar18;
      }
      dst->tpixels[uVar11][uVar7] =
           uVar21 & 0xff | (uVar22 & 0xff) << 8 | (uVar8 & 0xff) << 0x10 | uVar10 << 0x18;
      lVar20 = lVar20 + 1;
    }
  }
  return;
}

Assistant:

static void
applyCoeffs(gdImagePtr src, gdImagePtr dst, double *coeffs, int radius, 
            gdAxis axis)
{
    int line, numlines, linelen;

    if (axis == HORIZONTAL) {
        numlines = src->sy;
        linelen = src->sx;
    } else {
        numlines = src->sx;
        linelen = src->sy;
    }/* if .. else*/

    for (line = 0; line < numlines; line++) {
        applyCoeffsLine(src, dst, line, linelen, coeffs, radius, axis);
    }/* for */
}